

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O1

void deqp::gls::anon_unknown_1::render
               (TestLog *log,RenderContext *renderContext,RenderBits renderBits,Random *rng,
               ShaderProgram *program,TextureBuffer *texture,PixelBufferAccess *target)

{
  ulong uVar1;
  ostringstream *this;
  int iVar2;
  _func_int *__s;
  TextureBuffer *buffer;
  RenderContext *pRVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  size_t sVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ObjectTraits *pOVar9;
  undefined4 extraout_var_03;
  char **__args;
  char *pcVar10;
  VertexShader *pVVar11;
  long lVar12;
  ulong uVar13;
  Renderer renderer;
  ScopedLogSection renderSection;
  vector<const_char_*,_std::allocator<const_char_*>_> usedAs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> coords_1;
  anon_struct_16_2_44180aad bitInfos [4];
  VertexAttrib vertexAttribs [1];
  Random rng_1;
  Program program_1;
  ConstPixelBufferAccess effectiveAccess;
  Random rng_2;
  CoordFragmentShader coordFragmmentShader;
  PrimitiveList primitives;
  ostringstream stream;
  VertexArray vao;
  undefined1 auStack_598 [7];
  Renderer local_591;
  deUint32 local_590;
  int local_58c;
  TextureBuffer *local_588;
  ShaderProgram *local_580;
  RenderContext *local_578;
  ScopedLogSection local_570;
  VertexShader local_568;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_528;
  RenderBits aRStack_510 [2];
  VertexShader local_508;
  TextureFormat TStack_4d0;
  int aiStack_4c8 [2];
  int local_4c0;
  int local_4bc [2];
  int local_4b4;
  void *local_4b0;
  TestLog *local_4a0;
  VertexAttrib local_498;
  FragmentShader local_470;
  TextureFormat local_438;
  int local_430 [2];
  int local_428;
  int local_424 [2];
  int local_41c;
  void *local_418;
  Program local_410;
  ConstPixelBufferAccess local_3f8;
  DrawCommand local_3d0;
  FragmentShader local_3a0;
  MultisamplePixelBufferAccess local_368;
  undefined1 local_340 [16];
  undefined1 local_330 [96];
  ios_base local_2d0 [72];
  undefined8 local_288;
  int local_280;
  int local_27c;
  int local_278;
  undefined8 local_274;
  LineState local_26c;
  bool local_268;
  undefined8 local_264;
  TextureFormat local_1c8;
  RenderTarget *pRStack_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  local_580 = program;
  local_578 = renderContext;
  local_1b0._0_8_ = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Render Texture buffer","");
  local_340._0_8_ = local_330;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_340,"Render Texture Buffer","");
  tcu::ScopedLogSection::ScopedLogSection(&local_570,log,(string *)local_1b0,(string *)local_340);
  local_4a0 = log;
  if ((undefined1 *)local_340._0_8_ != local_330) {
    operator_delete((void *)local_340._0_8_,local_330._0_8_ + 1);
  }
  pRVar3 = local_578;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != local_1a0) {
    operator_delete((void *)local_1b0._0_8_,
                    CONCAT44(local_1a0[0]._M_allocated_capacity._4_4_,
                             (undefined4)local_1a0[0]._M_allocated_capacity) + 1);
  }
  local_590 = deRandom_getUint32(&rng->m_rnd);
  local_58c = 0;
  iVar4 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  (**(code **)(CONCAT44(extraout_var,iVar4) + 0x868))(0x8c2b,&local_58c);
  iVar4 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  dVar5 = (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x800))();
  glu::checkError(dVar5,"query GL_MAX_TEXTURE_BUFFER_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x303);
  local_508.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x8;
  TStack_4d0 = (TextureFormat)0x1d00029;
  local_508.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&DAT_00000004;
  local_508.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x1d0001a;
  local_508.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
  local_508.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x1d0000e;
  local_508._vptr_VertexShader = (_func_int **)&DAT_00000001;
  local_508.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1d00001;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_340);
  local_568._vptr_VertexShader = (_func_int **)0x0;
  local_568.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_568.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar12 = 8;
  do {
    if ((*(RenderBits *)((long)aRStack_510 + lVar12) & renderBits) != RENDERBITS_NONE) {
      __args = (char **)((long)&local_508._vptr_VertexShader + lVar12);
      if (local_568.m_inputs.
          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_568.m_inputs.
          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<char_const*,std::allocator<char_const*>>::_M_realloc_insert<char_const*const&>
                  ((vector<char_const*,std::allocator<char_const*>> *)&local_568,
                   (iterator)
                   local_568.m_inputs.
                   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start,__args);
      }
      else {
        *(char **)local_568.m_inputs.
                  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start = *__args;
        local_568.m_inputs.
        super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((long)local_568.m_inputs.
                             super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start + 8);
      }
    }
    lVar12 = lVar12 + 0x10;
  } while (lVar12 != 0x48);
  local_588 = texture;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_340,"Render using texture buffer as ",0x1f);
  uVar7 = (ulong)((long)local_568.m_inputs.
                        super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start -
                 (long)local_568._vptr_VertexShader) >> 3;
  if (0 < (int)uVar7) {
    uVar13 = 0;
    do {
      uVar1 = uVar13 + 1;
      lVar12 = 5;
      pcVar10 = " and ";
      if ((int)uVar7 < 2 || uVar1 != (uVar7 & 0xffffffff)) {
        lVar12 = 2;
        pcVar10 = ", ";
        if (uVar13 != 0) goto LAB_018d80fc;
      }
      else {
LAB_018d80fc:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,pcVar10,lVar12);
      }
      __s = local_568._vptr_VertexShader[uVar13];
      if (__s == (_func_int *)0x0) {
        std::ios::clear((int)(auStack_598 + *(long *)(local_340._0_8_ + -0x18)) + 600);
      }
      else {
        sVar8 = strlen((char *)__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,(char *)__s,sVar8);
      }
      uVar7 = (ulong)((long)local_568.m_inputs.
                            super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start -
                     (long)local_568._vptr_VertexShader) >> 3;
      uVar13 = uVar1;
    } while ((long)uVar1 < (long)(int)uVar7);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_340,".",1);
  this = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = local_4a0;
  std::__cxx11::ostringstream::ostringstream(this);
  pRVar3 = local_578;
  buffer = local_588;
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this,(char *)local_470._vptr_FragmentShader,
             (long)local_470.m_inputs.
                   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if ((pointer *)local_470._vptr_FragmentShader !=
      &local_470.m_inputs.
       super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
       super__Vector_impl_data._M_finish) {
    operator_delete(local_470._vptr_FragmentShader,
                    (ulong)((long)&(local_470.m_inputs.
                                    super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->type + 1));
  }
  std::__cxx11::ostringstream::~ostringstream(this);
  std::ios_base::~ios_base(local_138);
  if (local_568._vptr_VertexShader != (_func_int **)0x0) {
    operator_delete(local_568._vptr_VertexShader,
                    (long)local_568.m_inputs.
                          super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_568._vptr_VertexShader);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_340);
  std::ios_base::~ios_base(local_2d0);
  iVar4 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  lVar12 = CONCAT44(extraout_var_01,iVar4);
  iVar4 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  pOVar9 = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_1b0,(Functions *)CONCAT44(extraout_var_02,iVar4),pOVar9);
  iVar4 = (*pRVar3->_vptr_RenderContext[3])(pRVar3);
  pOVar9 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_340,(Functions *)CONCAT44(extraout_var_03,iVar4),pOVar9);
  (**(code **)(lVar12 + 0x1680))((local_580->m_program).m_program);
  (**(code **)(lVar12 + 0xd8))((undefined4)local_1a0[0]._M_allocated_capacity);
  (**(code **)(lVar12 + 0x610))(0);
  if ((renderBits & RENDERBITS_AS_VERTEX_ARRAY) == RENDERBITS_NONE) {
    deRandom_init((deRandom *)&local_470,local_590);
    local_508._vptr_VertexShader = (_func_int **)0x0;
    local_508.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_508.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_568._vptr_VertexShader = local_470._vptr_FragmentShader;
    local_568.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_470.m_inputs.
                  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    genRandomCoords((Random *)&local_568,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_508,0,0x200);
    (**(code **)(lVar12 + 0x40))(0x8892,local_330._0_8_ & 0xffffffff);
    (**(code **)(lVar12 + 0x150))
              (0x8892,(long)((int)local_508.m_inputs.
                                  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_start -
                            (int)local_508._vptr_VertexShader),local_508._vptr_VertexShader,0x88e0);
    (**(code **)(lVar12 + 0x19f0))(0,2,0x1401,1,0,0);
    if (local_508._vptr_VertexShader != (_func_int **)0x0) {
      operator_delete(local_508._vptr_VertexShader,
                      (long)local_508.m_inputs.
                            super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_508._vptr_VertexShader);
    }
  }
  else {
    (**(code **)(lVar12 + 0x40))(0x8892,buffer->m_glBuffer);
    (**(code **)(lVar12 + 0x19f0))(0,2,0x1401,1,0,0);
  }
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    uVar6 = (**(code **)(lVar12 + 0xb48))((local_580->m_program).m_program,"u_vtxSampler");
    (**(code **)(lVar12 + 8))(0x84c0);
    (**(code **)(lVar12 + 0xb8))(0x8c2a,buffer->m_glTexture);
    (**(code **)(lVar12 + 0x14f0))(uVar6,0);
  }
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    uVar6 = (**(code **)(lVar12 + 0xb48))((local_580->m_program).m_program,"u_fragSampler");
    (**(code **)(lVar12 + 8))(0x84c1);
    (**(code **)(lVar12 + 0xb8))(0x8c2a,buffer->m_glTexture);
    (**(code **)(lVar12 + 0x14f0))(uVar6,1);
    (**(code **)(lVar12 + 8))(0x84c0);
  }
  if ((renderBits & RENDERBITS_AS_INDEX_ARRAY) == RENDERBITS_NONE) {
    (**(code **)(lVar12 + 0x538))(4,0,0x18);
  }
  else {
    (**(code **)(lVar12 + 0x40))(0x8893,buffer->m_glBuffer);
    (**(code **)(lVar12 + 0x568))(4,0x18,0x1401,0);
    (**(code **)(lVar12 + 0x40))(0x8893,0);
  }
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    (**(code **)(lVar12 + 8))(0x84c1);
    (**(code **)(lVar12 + 0xb8))(0x8c2a,0);
  }
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    (**(code **)(lVar12 + 8))(0x84c0);
    (**(code **)(lVar12 + 0xb8))(0x8c2a,0);
  }
  (**(code **)(lVar12 + 0x40))(0x8892,0);
  (**(code **)(lVar12 + 0x518))(0);
  (**(code **)(lVar12 + 0xd8))(0);
  (**(code **)(lVar12 + 0x1680))(0);
  dVar5 = (**(code **)(lVar12 + 0x800))();
  glu::checkError(dVar5,"Rendering failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsTextureBufferCase.cpp"
                  ,0x28d);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_340);
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_1b0);
  glu::getTextureBufferEffectiveRefTexture(&local_3f8,buffer,local_58c);
  rr::VertexShader::VertexShader(&local_568,1,1);
  local_568._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_021cefe0;
  (local_568.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_568.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::VertexShader::VertexShader(&local_508,1,1);
  local_508._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_021cf010;
  TStack_4d0 = local_3f8.m_format;
  aiStack_4c8[0] = local_3f8.m_size.m_data[0];
  aiStack_4c8[1] = local_3f8.m_size.m_data[1];
  local_4c0 = local_3f8.m_size.m_data[2];
  local_4bc[0] = local_3f8.m_pitch.m_data[0];
  local_4bc[1] = local_3f8.m_pitch.m_data[1];
  local_4b4 = local_3f8.m_pitch.m_data[2];
  local_4b0 = local_3f8.m_data;
  (local_508.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_508.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  pVVar11 = &local_508;
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) == RENDERBITS_NONE) {
    pVVar11 = &local_568;
  }
  rr::FragmentShader::FragmentShader(&local_3a0,1,1);
  local_3a0._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_021cf040;
  (local_3a0.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_3a0.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&local_470,1,1);
  local_470._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_021cf070;
  local_438 = local_3f8.m_format;
  local_430[0] = local_3f8.m_size.m_data[0];
  local_430[1] = local_3f8.m_size.m_data[1];
  local_428 = local_3f8.m_size.m_data[2];
  local_41c = local_3f8.m_pitch.m_data[2];
  local_424[0] = local_3f8.m_pitch.m_data[0];
  local_424[1] = local_3f8.m_pitch.m_data[1];
  local_418 = local_3f8.m_data;
  (local_470.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_470.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_410.fragmentShader = &local_470;
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) == RENDERBITS_NONE) {
    local_410.fragmentShader = &local_3a0;
  }
  rr::Renderer::Renderer(&local_591);
  iVar4 = (target->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar2 = (target->super_ConstPixelBufferAccess).m_size.m_data[1];
  local_340._0_8_ = (pointer)0x100000000;
  local_340._8_8_ = (ObjectTraits *)0x0;
  local_330._0_8_ = 0x200000001;
  rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)(local_330 + 8));
  local_288 = 0x3f800000;
  local_280 = 0;
  local_274._0_4_ = 0.0;
  local_274._4_4_ = 1.0;
  local_26c.lineWidth = 1.0;
  local_268 = false;
  local_264 = 0xffffffff;
  local_330._0_8_ = local_330._0_8_ & 0xffffffff;
  local_27c = iVar4;
  local_278 = iVar2;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess
            ((MultisamplePixelBufferAccess *)&local_3d0,target);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_498);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess(&local_368);
  rr::RenderTarget::RenderTarget
            ((RenderTarget *)local_1b0,(MultisamplePixelBufferAccess *)&local_3d0,
             (MultisamplePixelBufferAccess *)&local_498,&local_368);
  local_410.geometryShader = (GeometryShader *)0x0;
  local_498.generic.v._8_8_ = 0;
  local_498.pointer = (void *)0x0;
  local_498.generic.v._0_8_ = 0;
  local_498.type = VERTEXATTRIBTYPE_FLOAT;
  local_498.size = 0;
  local_498.stride = 0;
  local_498.instanceDivisor = 0;
  local_528.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_528.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_410.vertexShader = pVVar11;
  if ((renderBits & RENDERBITS_AS_VERTEX_ARRAY) == RENDERBITS_NONE) {
    deRandom_init((deRandom *)&local_3d0,local_590);
    local_1c8 = (TextureFormat)local_3d0.state;
    pRStack_1c0 = local_3d0.renderTarget;
    genRandomCoords((Random *)&local_1c8,&local_528,0,0x200);
    local_498.pointer =
         local_528.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  else {
    local_498.pointer = (local_588->m_refBuffer).m_ptr;
  }
  local_498.type = VERTEXATTRIBTYPE_NONPURE_UNORM8;
  local_498.size = 2;
  local_3d0.renderTarget = (RenderTarget *)local_1b0;
  local_3d0.vertexAttribs = &local_498;
  if ((renderBits & RENDERBITS_AS_INDEX_ARRAY) == RENDERBITS_NONE) {
    rr::PrimitiveList::PrimitiveList((PrimitiveList *)&local_368,PRIMITIVETYPE_TRIANGLES,0x18,0);
    local_3d0.state = (RenderState *)local_340;
    local_3d0.program = &local_410;
    local_3d0.numVertexAttribs = 1;
    local_3d0.primitives = (PrimitiveList *)&local_368;
    rr::Renderer::draw(&local_591,&local_3d0);
  }
  else {
    rr::DrawIndices::DrawIndices
              ((DrawIndices *)&local_3d0,(local_588->m_refBuffer).m_ptr,INDEXTYPE_UINT8,0);
    rr::PrimitiveList::PrimitiveList
              ((PrimitiveList *)&local_368,PRIMITIVETYPE_TRIANGLES,0x18,(DrawIndices *)&local_3d0);
    local_3d0.state = (RenderState *)local_340;
    local_3d0.program = &local_410;
    local_3d0.numVertexAttribs = 1;
    local_3d0.primitives = (PrimitiveList *)&local_368;
    rr::Renderer::draw(&local_591,&local_3d0);
  }
  if (local_528.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_528.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_528.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_528.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  rr::Renderer::~Renderer(&local_591);
  rr::FragmentShader::~FragmentShader(&local_470);
  rr::FragmentShader::~FragmentShader(&local_3a0);
  rr::VertexShader::~VertexShader(&local_508);
  rr::VertexShader::~VertexShader(&local_568);
  tcu::TestLog::endSection(local_570.m_log);
  return;
}

Assistant:

void render (TestLog&						log,
			 glu::RenderContext&			renderContext,
			 RenderBits						renderBits,
			 de::Random&					rng,
			 glu::ShaderProgram&			program,
			 glu::TextureBuffer&			texture,
			 const tcu::PixelBufferAccess&	target)
{
	const tcu::ScopedLogSection	renderSection			(log, "Render Texture buffer", "Render Texture Buffer");
	const int					triangleCount			= 8;
	const deUint32				coordSeed				= rng.getUint32();
	int							maxTextureBufferSize	= 0;

	renderContext.getFunctions().getIntegerv(GL_MAX_TEXTURE_BUFFER_SIZE, &maxTextureBufferSize);
	GLU_EXPECT_NO_ERROR(renderContext.getFunctions().getError(), "query GL_MAX_TEXTURE_BUFFER_SIZE");
	DE_ASSERT(maxTextureBufferSize > 0); // checked in init()

	logRendering(log, renderBits);

	renderGL(renderContext, renderBits, coordSeed, triangleCount, program, texture);
	renderReference(renderBits, coordSeed, triangleCount, texture, maxTextureBufferSize, target);
}